

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

void __thiscall
BaseIndex::BlockConnected
          (BaseIndex *this,ChainstateRole role,shared_ptr<const_CBlock> *block,CBlockIndex *pindex)

{
  long lVar1;
  bool bVar2;
  __pointer_type pCVar3;
  CBlockIndex *pCVar4;
  ulong uVar5;
  char (*in_RCX) [15];
  int in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  CBlockIndex *best_block_index;
  BlockInfo block_info;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffe2c;
  base_blob<256U> *in_stack_fffffffffffffe30;
  CBlockIndex *in_stack_fffffffffffffe38;
  BaseIndex *in_stack_fffffffffffffe40;
  BaseIndex *in_stack_fffffffffffffe48;
  CBlockIndex *in_stack_fffffffffffffe50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  char (*in_stack_fffffffffffffe70) [15];
  BaseIndex *in_stack_fffffffffffffe78;
  ConstevalFormatString<2U> in_stack_fffffffffffffe88;
  char *fmt;
  LogFlags in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe9c;
  ConstevalFormatString<3U> fmt_00;
  string_view in_stack_fffffffffffffee0;
  string_view in_stack_fffffffffffffef0;
  undefined1 local_100 [88];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [3];
  Level in_stack_ffffffffffffffd0;
  char (*in_stack_ffffffffffffffe0) [15];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_ESI == 2) ||
     (fmt_00.fmt = (char *)in_RDI,
     bVar2 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffe40), !bVar2))
  goto LAB_00f719f5;
  pCVar3 = std::atomic<const_CBlockIndex_*>::load
                     ((atomic<const_CBlockIndex_*> *)in_stack_fffffffffffffe40,
                      (memory_order)((ulong)in_stack_fffffffffffffe38 >> 0x20));
  if (pCVar3 == (__pointer_type)0x0) {
    if (*(int *)(in_RCX[1] + 9) != 0) {
      FatalErrorf<char[15],int>
                (in_stack_fffffffffffffe78,in_stack_fffffffffffffe88,in_stack_fffffffffffffe70,
                 (int *)in_stack_fffffffffffffe68);
      goto LAB_00f719f5;
    }
  }
  else {
    pCVar4 = CBlockIndex::GetAncestor
                       (in_stack_fffffffffffffe50,(int)((ulong)in_stack_fffffffffffffe48 >> 0x20));
    if (pCVar4 != *(CBlockIndex **)(*in_RCX + 8)) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe48,
                 (char *)in_stack_fffffffffffffe40);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe48,
                 (char *)in_stack_fffffffffffffe40);
      CBlockIndex::GetBlockHash(in_stack_fffffffffffffe38);
      base_blob<256u>::ToString_abi_cxx11_(in_stack_fffffffffffffe30);
      CBlockIndex::GetBlockHash(in_stack_fffffffffffffe38);
      base_blob<256u>::ToString_abi_cxx11_(in_stack_fffffffffffffe30);
      uVar6 = 2;
      LogPrintFormatInternal<char[15],std::__cxx11::string,std::__cxx11::string>
                (in_stack_fffffffffffffef0,in_stack_fffffffffffffee0,in_stack_fffffffffffffe9c,
                 in_stack_fffffffffffffe90,in_stack_ffffffffffffffd0,fmt_00,
                 in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8,in_stack_fffffffffffffff0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe2c,uVar6));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe2c,uVar6));
      goto LAB_00f719f5;
    }
    if ((pCVar3 != *(__pointer_type *)(*in_RCX + 8)) &&
       (bVar2 = Rewind(in_stack_fffffffffffffe48,(CBlockIndex *)in_stack_fffffffffffffe40,
                       in_stack_fffffffffffffe38), !bVar2)) {
      GetName_abi_cxx11_((BaseIndex *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28))
      ;
      FatalErrorf<char[15],std::__cxx11::string>
                (in_stack_fffffffffffffe78,in_stack_fffffffffffffe88,in_stack_fffffffffffffe70,
                 in_stack_fffffffffffffe68);
      goto LAB_00f719f5;
    }
  }
  std::__shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>::get
            ((__shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2> *)
             CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  kernel::MakeBlockInfo
            ((CBlockIndex *)in_stack_fffffffffffffe48,(CBlock *)in_stack_fffffffffffffe40);
  uVar5 = (**(code **)(*in_RDI + 0x60))(in_RDI,local_100);
  if ((uVar5 & 1) == 0) {
    fmt = "%s: Failed to write block %s to index";
    CBlockIndex::GetBlockHash(in_stack_fffffffffffffe38);
    args_1 = local_a8;
    base_blob<256u>::ToString_abi_cxx11_(in_stack_fffffffffffffe30);
    FatalErrorf<char[15],std::__cxx11::string>
              (in_stack_fffffffffffffe78,(ConstevalFormatString<2U>)fmt,in_RCX,args_1);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  }
  else {
    SetBestBlockIndex(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  }
LAB_00f719f5:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void BaseIndex::BlockConnected(ChainstateRole role, const std::shared_ptr<const CBlock>& block, const CBlockIndex* pindex)
{
    // Ignore events from the assumed-valid chain; we will process its blocks
    // (sequentially) after it is fully verified by the background chainstate. This
    // is to avoid any out-of-order indexing.
    //
    // TODO at some point we could parameterize whether a particular index can be
    // built out of order, but for now just do the conservative simple thing.
    if (role == ChainstateRole::ASSUMEDVALID) {
        return;
    }

    // Ignore BlockConnected signals until we have fully indexed the chain.
    if (!m_synced) {
        return;
    }

    const CBlockIndex* best_block_index = m_best_block_index.load();
    if (!best_block_index) {
        if (pindex->nHeight != 0) {
            FatalErrorf("%s: First block connected is not the genesis block (height=%d)",
                       __func__, pindex->nHeight);
            return;
        }
    } else {
        // Ensure block connects to an ancestor of the current best block. This should be the case
        // most of the time, but may not be immediately after the sync thread catches up and sets
        // m_synced. Consider the case where there is a reorg and the blocks on the stale branch are
        // in the ValidationInterface queue backlog even after the sync thread has caught up to the
        // new chain tip. In this unlikely event, log a warning and let the queue clear.
        if (best_block_index->GetAncestor(pindex->nHeight - 1) != pindex->pprev) {
            LogPrintf("%s: WARNING: Block %s does not connect to an ancestor of "
                      "known best chain (tip=%s); not updating index\n",
                      __func__, pindex->GetBlockHash().ToString(),
                      best_block_index->GetBlockHash().ToString());
            return;
        }
        if (best_block_index != pindex->pprev && !Rewind(best_block_index, pindex->pprev)) {
            FatalErrorf("%s: Failed to rewind index %s to a previous chain tip",
                       __func__, GetName());
            return;
        }
    }
    interfaces::BlockInfo block_info = kernel::MakeBlockInfo(pindex, block.get());
    if (CustomAppend(block_info)) {
        // Setting the best block index is intentionally the last step of this
        // function, so BlockUntilSyncedToCurrentChain callers waiting for the
        // best block index to be updated can rely on the block being fully
        // processed, and the index object being safe to delete.
        SetBestBlockIndex(pindex);
    } else {
        FatalErrorf("%s: Failed to write block %s to index",
                   __func__, pindex->GetBlockHash().ToString());
        return;
    }
}